

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolution1d.cpp
# Opt level: O2

int __thiscall
ncnn::Deconvolution1D::forward
          (Deconvolution1D *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  uint uVar1;
  uint kernel_w;
  uint _h;
  int iVar2;
  int iVar3;
  int iVar4;
  Mat *bottom_blob;
  Mat *top_blob;
  int *piVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  long lVar10;
  void *pvVar11;
  Allocator **ppAVar12;
  void *pvVar13;
  ulong uVar14;
  int iVar15;
  void *pvVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  void *pvVar20;
  int j;
  ulong uVar21;
  int k;
  ulong uVar22;
  Mat local_168;
  Mat local_118;
  Mat local_c8;
  Mat local_78;
  
  bottom_blob = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
  top_blob = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
  uVar1 = bottom_blob->h;
  kernel_w = bottom_blob[1].w;
  lVar10 = (long)(int)kernel_w;
  _h = bottom_blob[1].h;
  local_78.cstep = 0;
  local_78.data = (void *)0x0;
  local_78.refcount._0_4_ = 0;
  local_78.refcount._4_4_ = 0;
  local_78.elemsize._0_4_ = 0;
  local_78._20_8_ = 0;
  local_78.allocator = (Allocator *)0x0;
  local_78.dims = 0;
  local_78.w = 0;
  local_78.h = 0;
  local_78.d = 0;
  local_78.c = 0;
  flatten(bottom_blob + 1,&local_78,opt);
  iVar15 = -100;
  if ((local_78.data == (void *)0x0) || ((long)local_78.c * local_78.cstep == 0)) goto LAB_004eeb12;
  local_c8.cstep = 0;
  local_c8.data = (void *)0x0;
  local_c8.refcount._0_4_ = 0;
  local_c8.refcount._4_4_ = 0;
  local_c8.elemsize._0_4_ = 0;
  local_c8._20_8_ = 0;
  local_c8.allocator = (Allocator *)0x0;
  local_c8.dims = 0;
  local_c8.w = 0;
  local_c8.h = 0;
  local_c8.d = 0;
  local_c8.c = 0;
  Mat::create(&local_c8,uVar1 * kernel_w * _h,4,opt->workspace_allocator);
  iVar15 = -100;
  if ((local_c8.data != (void *)0x0) && ((long)local_c8.c * local_c8.cstep != 0)) {
    ppAVar12 = &opt->workspace_allocator;
    uVar14 = 0;
    uVar17 = 0;
    if (0 < (int)kernel_w) {
      uVar17 = (ulong)kernel_w;
    }
    uVar18 = 0;
    if (0 < (int)uVar1) {
      uVar18 = (ulong)uVar1;
    }
    uVar19 = 0;
    if (0 < (int)_h) {
      uVar19 = (ulong)_h;
    }
    pvVar11 = local_c8.data;
    pvVar13 = local_78.data;
    for (; uVar14 != uVar19; uVar14 = uVar14 + 1) {
      pvVar16 = pvVar11;
      pvVar20 = pvVar13;
      for (uVar21 = 0; uVar21 != uVar18; uVar21 = uVar21 + 1) {
        for (uVar22 = 0; uVar17 != uVar22; uVar22 = uVar22 + 1) {
          *(undefined4 *)((long)pvVar16 + uVar22 * 4) = *(undefined4 *)((long)pvVar20 + uVar22 * 4);
        }
        pvVar16 = (void *)((long)pvVar16 + lVar10 * 4);
        pvVar20 = (void *)((long)pvVar20 + (int)_h * lVar10 * 4);
      }
      pvVar11 = (void *)((long)pvVar11 + (int)uVar1 * lVar10 * 4);
      pvVar13 = (void *)((long)pvVar13 + lVar10 * 4);
    }
    local_118.cstep = 0;
    local_118.data = (void *)0x0;
    local_118.refcount._0_4_ = 0;
    local_118.refcount._4_4_ = 0;
    local_118.elemsize._0_4_ = 0;
    local_118._20_8_ = 0;
    local_118.allocator = (Allocator *)0x0;
    local_118.dims = 0;
    local_118.w = 0;
    local_118.h = 0;
    local_118.d = 0;
    local_118.c = 0;
    if (this->bias_term == 0) {
LAB_004ee8b7:
      iVar15 = this->dilation_w;
      iVar2 = bottom_blob->w;
      iVar3 = this->stride_w;
      iVar4 = this->output_pad_right;
      local_168.cstep = 0;
      local_168.data = (void *)0x0;
      local_168.refcount._0_4_ = 0;
      local_168.refcount._4_4_ = 0;
      local_168.elemsize._0_4_ = 0;
      local_168.elemsize._4_4_ = 0;
      local_168.elempack = 0;
      local_168.allocator = (Allocator *)0x0;
      local_168.dims = 0;
      local_168.w = 0;
      local_168.h = 0;
      local_168.d = 0;
      local_168.c = 0;
      if ((this->pad_left < 1) && ((this->pad_right < 1 && (this->output_w < 1)))) {
        if (&local_168 != top_blob) {
          piVar5 = top_blob->refcount;
          if (piVar5 != (int *)0x0) {
            LOCK();
            *piVar5 = *piVar5 + 1;
            UNLOCK();
          }
          local_168.data = top_blob->data;
          local_168.refcount._0_4_ = SUB84(top_blob->refcount,0);
          local_168.refcount._4_4_ = (undefined4)((ulong)top_blob->refcount >> 0x20);
          local_168.elemsize._0_4_ = (undefined4)top_blob->elemsize;
          local_168.elemsize._4_4_ = (undefined4)(top_blob->elemsize >> 0x20);
          local_168.elempack = top_blob->elempack;
          local_168.allocator = top_blob->allocator;
          uVar6 = top_blob->dims;
          uVar7 = top_blob->w;
          uVar8 = top_blob->h;
          uVar9 = top_blob->d;
          local_168.c = top_blob->c;
          local_168.cstep = top_blob->cstep;
          local_168.dims = uVar6;
          local_168.w = uVar7;
          local_168.h = uVar8;
          local_168.d = uVar9;
        }
        ppAVar12 = &opt->blob_allocator;
      }
      Mat::create(&local_168,iVar4 + (kernel_w - 1) * iVar15 + (iVar2 + -1) * iVar3 + 1,_h,4,
                  *ppAVar12);
      if ((local_168.data == (void *)0x0) || ((long)local_168.c * local_168.cstep == 0)) {
LAB_004eea74:
        iVar15 = -100;
      }
      else {
        deconvolution1d(bottom_blob,&local_168,&local_c8,&local_118,kernel_w,this->stride_w,
                        this->dilation_w,this->activation_type,&this->activation_params,
                        (Option *)0xffffffffffffff9c);
        cut_padding(this,&local_168,top_blob,opt);
        if ((top_blob->data == (void *)0x0) ||
           (iVar15 = 0, (long)top_blob->c * top_blob->cstep == 0)) goto LAB_004eea74;
      }
      piVar5 = (int *)CONCAT44(local_168.refcount._4_4_,local_168.refcount._0_4_);
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          if (local_168.allocator == (Allocator *)0x0) {
            free(local_168.data);
          }
          else {
            (*(local_168.allocator)->_vptr_Allocator[3])();
          }
        }
      }
    }
    else {
      flatten((bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start + 2,&local_118,opt);
      iVar15 = -100;
      if ((local_118.data != (void *)0x0) && ((long)local_118.c * local_118.cstep != 0))
      goto LAB_004ee8b7;
    }
    piVar5 = (int *)CONCAT44(local_118.refcount._4_4_,local_118.refcount._0_4_);
    if (piVar5 != (int *)0x0) {
      LOCK();
      *piVar5 = *piVar5 + -1;
      UNLOCK();
      if (*piVar5 == 0) {
        if (local_118.allocator == (Allocator *)0x0) {
          free(local_118.data);
        }
        else {
          (*(local_118.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  piVar5 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
  if (piVar5 != (int *)0x0) {
    LOCK();
    *piVar5 = *piVar5 + -1;
    UNLOCK();
    if (*piVar5 == 0) {
      if (local_c8.allocator == (Allocator *)0x0) {
        free(local_c8.data);
      }
      else {
        (*(local_c8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
LAB_004eeb12:
  piVar5 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
  if (piVar5 != (int *)0x0) {
    LOCK();
    *piVar5 = *piVar5 + -1;
    UNLOCK();
    if (*piVar5 == 0) {
      if (local_78.allocator == (Allocator *)0x0) {
        free(local_78.data);
      }
      else {
        (*(local_78.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar15;
}

Assistant:

int Deconvolution1D::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    const Mat& _weight_data = bottom_blobs[1];
    Mat& top_blob = top_blobs[0];

    const int _num_input = bottom_blob.h;
    const int _kernel_w = _weight_data.w;
    const int _num_output = _weight_data.h * 1;

    Mat weight_data_flattened;
    flatten(_weight_data, weight_data_flattened, opt);
    if (weight_data_flattened.empty())
        return -100;

    // transpose group-inch/group-outch/group-kw to group-outch/group-inch/group-kw
    Mat weight_data_transposed;
    {
        weight_data_transposed.create(_kernel_w * _num_output * _num_input / 1, 4u, opt.workspace_allocator);
        if (weight_data_transposed.empty())
            return -100;

        const int outch_g = _num_output / 1;
        const int inch_g = _num_input / 1;
        const int maxk = _kernel_w;

        for (int g = 0; g < 1; g++)
        {
            // reorder weight from inch-outch to outch-inch
            float* wg2 = (float*)weight_data_transposed + g * outch_g * inch_g * maxk;
            const float* wg = (const float*)weight_data_flattened + g * inch_g * outch_g * maxk;
            for (int i = 0; i < outch_g; i++)
            {
                for (int j = 0; j < inch_g; j++)
                {
                    for (int k = 0; k < maxk; k++)
                    {
                        wg2[(i * inch_g + j) * maxk + k] = wg[(j * outch_g + i) * maxk + k];
                    }
                }
            }
        }
    }

    Mat bias_data_flattened;
    if (bias_term)
    {
        const Mat& _bias_data = bottom_blobs[2];
        flatten(_bias_data, bias_data_flattened, opt);
        if (bias_data_flattened.empty())
            return -100;
    }

    const int w = bottom_blob.w;

    const int kernel_extent_w = dilation_w * (_kernel_w - 1) + 1;

    int outw = (w - 1) * stride_w + kernel_extent_w + output_pad_right;

    Mat top_blob_bordered;
    if (pad_left > 0 || pad_right > 0 || output_w > 0)
    {
        top_blob_bordered.create(outw, _num_output, 4u, opt.workspace_allocator);
    }
    else
    {
        top_blob_bordered = top_blob;
        top_blob_bordered.create(outw, _num_output, 4u, opt.blob_allocator);
    }
    if (top_blob_bordered.empty())
        return -100;

    int ret = deconvolution1d(bottom_blob, top_blob_bordered, weight_data_transposed, bias_data_flattened, _kernel_w, stride_w, dilation_w, activation_type, activation_params, opt);
    if (ret != 0)
        return ret;

    cut_padding(top_blob_bordered, top_blob, opt);
    if (top_blob.empty())
        return -100;

    return 0;
}